

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManComputeOverlap2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vVisit;
  int *piVar4;
  Vec_Str_t *vLabel;
  char *__s;
  int iVar5;
  long lVar6;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x14b,"int Gia_ManComputeOverlap2(Gia_Man_t *)");
  }
  iVar3 = p->nObjs;
  iVar5 = p->vCos->nSize;
  iVar1 = p->vCis->nSize;
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = 100;
  vVisit->nSize = 0;
  piVar4 = (int *)malloc(400);
  vVisit->pArray = piVar4;
  vLabel = (Vec_Str_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar2 = iVar3;
  }
  vLabel->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar2);
  }
  iVar5 = (iVar5 - iVar3) + iVar1 + 1;
  vLabel->pArray = __s;
  vLabel->nSize = iVar3;
  memset(__s,0,(long)iVar3);
  if (1 < iVar3) {
    lVar6 = 1;
    do {
      if (p->vMapping->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[lVar6] != 0) {
        iVar3 = Gia_ManComputeOverlap2One(p,(int)lVar6,vLabel,vVisit);
        iVar5 = iVar5 + iVar3;
        iVar3 = p->nObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
    __s = vLabel->pArray;
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  free(vLabel);
  if (vVisit->pArray != (int *)0x0) {
    free(vVisit->pArray);
  }
  free(vVisit);
  return iVar5;
}

Assistant:

int Gia_ManComputeOverlap2( Gia_Man_t * p )
{
    Vec_Int_t * vVisit;
    Vec_Str_t * vLabel;
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    vVisit = Vec_IntAlloc( 100 );
    vLabel = Vec_StrStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlap2One( p, i, vLabel, vVisit );
    Vec_StrFree( vLabel );
    Vec_IntFree( vVisit );
    return Count;
}